

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForMessage
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *provided)

{
  bool bVar1;
  int iVar2;
  EnumDescriptor *enumdesc;
  Descriptor *pDVar3;
  int local_78;
  int local_74;
  int i_1;
  int i;
  undefined1 local_50 [8];
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provided_local;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  pDVar3 = desc;
  name.field_2._8_8_ = provided;
  bVar1 = anon_unknown_0::IgnoreMessage(desc);
  if (!bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,pDVar3);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)name.field_2._8_8_,(string *)local_50);
    for (local_74 = 0; iVar2 = Descriptor::enum_type_count(desc), local_74 < iVar2;
        local_74 = local_74 + 1) {
      enumdesc = Descriptor::enum_type(desc,local_74);
      FindProvidesForEnum(this,options,printer,enumdesc,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)name.field_2._8_8_);
    }
    FindProvidesForOneOfEnums
              (options,printer,desc,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)name.field_2._8_8_);
    for (local_78 = 0; iVar2 = Descriptor::nested_type_count(desc), local_78 < iVar2;
        local_78 = local_78 + 1) {
      pDVar3 = Descriptor::nested_type(desc,local_78);
      FindProvidesForMessage
                (this,options,printer,pDVar3,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)name.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void Generator::FindProvidesForMessage(const GeneratorOptions& options,
                                       io::Printer* printer,
                                       const Descriptor* desc,
                                       std::set<std::string>* provided) const {
  if (IgnoreMessage(desc)) {
    return;
  }

  std::string name = GetMessagePath(options, desc);
  provided->insert(name);

  for (int i = 0; i < desc->enum_type_count(); i++) {
    FindProvidesForEnum(options, printer, desc->enum_type(i), provided);
  }

  FindProvidesForOneOfEnums(options, printer, desc, provided);

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindProvidesForMessage(options, printer, desc->nested_type(i), provided);
  }
}